

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockfilterindex.cpp
# Opt level: O0

bool __thiscall BlockFilterIndex::CustomCommit(BlockFilterIndex *this,CDBBatch *batch)

{
  long lVar1;
  bool bVar2;
  FlatFilePos *pos_00;
  FlatFileSeq *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  Level in_stack_00000060;
  char (*in_stack_00000070) [13];
  int *in_stack_00000078;
  FlatFilePos *pos;
  AutoFile file;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  FlatFilePos *in_stack_fffffffffffffec8;
  uchar *in_stack_fffffffffffffed0;
  CDBBatch *in_stack_fffffffffffffed8;
  vector<std::byte,_std::allocator<std::byte>_> *in_stack_fffffffffffffef0;
  undefined7 in_stack_fffffffffffffef8;
  undefined1 in_stack_fffffffffffffeff;
  AutoFile *in_stack_ffffffffffffff00;
  LogFlags in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff2c;
  undefined1 in_stack_ffffffffffffff47;
  undefined1 local_99;
  ConstevalFormatString<2U> in_stack_ffffffffffffff68;
  string_view in_stack_ffffffffffffff70;
  string_view in_stack_ffffffffffffff80;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pos_00 = (FlatFilePos *)(in_RDI + 0xc0);
  std::unique_ptr<FlatFileSeq,_std::default_delete<FlatFileSeq>_>::operator->
            ((unique_ptr<FlatFileSeq,_std::default_delete<FlatFileSeq>_> *)
             CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  FlatFileSeq::Open(in_RSI,pos_00,(bool)in_stack_ffffffffffffff47);
  std::vector<std::byte,_std::allocator<std::byte>_>::vector
            ((vector<std::byte,_std::allocator<std::byte>_> *)
             CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  AutoFile::AutoFile(in_stack_ffffffffffffff00,
                     (FILE *)CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8),
                     in_stack_fffffffffffffef0);
  std::vector<std::byte,_std::allocator<std::byte>_>::~vector
            ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_fffffffffffffec8);
  bVar2 = AutoFile::IsNull((AutoFile *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8)
                          );
  if (bVar2) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffed8,
               (char *)in_stack_fffffffffffffed0);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffed8,
               (char *)in_stack_fffffffffffffed0);
    in_stack_fffffffffffffeb8 = 4;
    LogPrintFormatInternal<char[13],int>
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff70,in_stack_ffffffffffffff2c,
               in_stack_ffffffffffffff20,in_stack_00000060,in_stack_ffffffffffffff68,
               in_stack_00000070,in_stack_00000078);
    local_99 = false;
  }
  else {
    bVar2 = AutoFile::Commit((AutoFile *)
                             CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    if (bVar2) {
      CDBBatch::Write<unsigned_char,FlatFilePos>
                (in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
      local_99 = true;
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffed8,
                 (char *)in_stack_fffffffffffffed0);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffed8,
                 (char *)in_stack_fffffffffffffed0);
      in_stack_fffffffffffffeb8 = 4;
      LogPrintFormatInternal<char[13],int>
                (in_stack_ffffffffffffff80,in_stack_ffffffffffffff70,in_stack_ffffffffffffff2c,
                 0x111e37c,in_stack_00000060,in_stack_ffffffffffffff68,in_stack_00000070,
                 in_stack_00000078);
      local_99 = false;
    }
  }
  AutoFile::~AutoFile((AutoFile *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_99;
  }
  __stack_chk_fail();
}

Assistant:

bool BlockFilterIndex::CustomCommit(CDBBatch& batch)
{
    const FlatFilePos& pos = m_next_filter_pos;

    // Flush current filter file to disk.
    AutoFile file{m_filter_fileseq->Open(pos)};
    if (file.IsNull()) {
        LogError("%s: Failed to open filter file %d\n", __func__, pos.nFile);
        return false;
    }
    if (!file.Commit()) {
        LogError("%s: Failed to commit filter file %d\n", __func__, pos.nFile);
        return false;
    }

    batch.Write(DB_FILTER_POS, pos);
    return true;
}